

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void ParseLineSafe(bool parselabels)

{
  char *pcVar1;
  char *__src;
  char *__src_00;
  
  pcVar1 = lp;
  if (sline[0] < '\x01') {
LAB_00121fe6:
    __src = (char *)0x0;
  }
  else {
    __src = strdup(sline);
    if (__src == (char *)0x0) {
      ErrorOOM();
      goto LAB_00121fe6;
    }
  }
  if ('\0' < sline2[0]) {
    __src_00 = strdup(sline2);
    if (__src_00 != (char *)0x0) goto LAB_00122011;
    ErrorOOM();
  }
  __src_00 = (char *)0x0;
LAB_00122011:
  ParseLine(parselabels);
  sline[0] = '\0';
  sline2[0] = '\0';
  if (__src_00 != (char *)0x0) {
    strcpy(sline2,__src_00);
    free(__src_00);
  }
  if (__src != (char *)0x0) {
    strcpy(sline,__src);
    free(__src);
  }
  lp = pcVar1;
  return;
}

Assistant:

void ParseLineSafe(bool parselabels) {
	char* tmp = NULL, * tmp2 = NULL;
	char* rp = lp;
	if (sline[0] > 0) {
		tmp = STRDUP(sline);
		if (tmp == NULL) ErrorOOM();
	}
	if (sline2[0] > 0) {
		tmp2 = STRDUP(sline2);
		if (tmp2 == NULL) ErrorOOM();
	}

	ParseLine(parselabels);

	*sline = 0;
	*sline2 = 0;

	if (tmp2 != NULL) {
		STRCPY(sline2, LINEMAX2, tmp2);
		free(tmp2);
	}
	if (tmp != NULL) {
		STRCPY(sline, LINEMAX2, tmp);
		free(tmp);
	}
	lp = rp;
}